

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiShrinkWidthItem *pIVar6;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  undefined4 uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int section_n;
  ImGuiID IVar20;
  uint uVar21;
  int iVar22;
  ImGuiTabItem *__dest;
  ImGuiShrinkWidthItem *__dest_00;
  char *__dest_01;
  long lVar23;
  long lVar24;
  char *pcVar25;
  ImGuiID IVar26;
  int iVar27;
  uint uVar28;
  ImGuiTabItem *pIVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  byte bVar33;
  uint uVar34;
  ImGuiID *pIVar35;
  ImGuiID *pIVar36;
  int iVar37;
  long lVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  ImGuiID *local_120;
  float local_114;
  undefined8 local_100;
  float local_f8 [3];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  int local_ac [2];
  float local_a4;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  ImVec4 local_78;
  undefined8 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar15 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  uVar34 = (tab_bar->Tabs).Size;
  if ((int)uVar34 < 1) {
    bVar33 = 0;
    uVar21 = 0;
  }
  else {
    pIVar29 = (tab_bar->Tabs).Data;
    lVar23 = 0;
    uVar30 = 0;
    uVar21 = 0;
    bVar33 = 0;
    do {
      pIVar35 = (ImGuiID *)((long)&pIVar29->ID + lVar23);
      if ((*(int *)((long)&pIVar29->LastFrameVisible + lVar23) < tab_bar->PrevFrameVisible) ||
         ((&pIVar29->WantClose)[lVar23] == true)) {
        IVar26 = *pIVar35;
        if (tab_bar->VisibleTabId == IVar26) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar26) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar26) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar32 = (ulong)uVar21;
        if (uVar30 != uVar32) {
          if (((int)uVar21 < 0) || ((int)uVar34 <= (int)uVar21)) goto LAB_0018ae95;
          *(undefined8 *)((long)&pIVar29[uVar32].NameOffset + 1) =
               *(undefined8 *)((long)pIVar35 + 0x1d);
          IVar26 = *pIVar35;
          IVar20 = pIVar35[1];
          IVar7 = pIVar35[2];
          IVar8 = pIVar35[3];
          fVar39 = (float)pIVar35[5];
          fVar42 = (float)pIVar35[6];
          IVar9 = pIVar35[7];
          pfVar1 = &pIVar29[uVar32].Offset;
          *pfVar1 = (float)pIVar35[4];
          pfVar1[1] = fVar39;
          pfVar1[2] = fVar42;
          pfVar1[3] = (float)IVar9;
          pIVar29 = pIVar29 + uVar32;
          pIVar29->ID = IVar26;
          pIVar29->Flags = IVar20;
          pIVar29->LastFrameVisible = IVar7;
          pIVar29->LastFrameSelected = IVar8;
          uVar34 = (tab_bar->Tabs).Size;
        }
        if ((int)uVar34 <= (int)uVar21) goto LAB_0018ae95;
        pIVar29 = (tab_bar->Tabs).Data;
        pIVar29[uVar32].IndexDuringLayout = (ImS16)uVar21;
        uVar31 = pIVar29[uVar32].Flags;
        lVar38 = 0;
        if ((uVar31 & 0x40) == 0) {
          lVar38 = (ulong)((char)(byte)uVar31 < '\0') + 1;
        }
        if (uVar21 != 0) {
          if ((int)uVar34 < (int)uVar21) goto LAB_0018ae95;
          bVar33 = (pIVar29[(long)(int)uVar21 + -1].Flags & 0x40U) == 0 & (byte)uVar31 >> 6 | bVar33
                   | ((uVar31 & 0xc0) != 0x80 &&
                     (pIVar29[(long)(int)uVar21 + -1].Flags & 0xc0U) == 0x80);
        }
        local_f8[lVar38 * 3] = (float)((int)local_f8[lVar38 * 3] + 1);
        uVar21 = uVar21 + 1;
      }
      uVar30 = uVar30 + 1;
      lVar23 = lVar23 + 0x28;
    } while ((long)uVar30 < (long)(int)uVar34);
  }
  if (uVar34 != uVar21) {
    iVar27 = (tab_bar->Tabs).Capacity;
    if (iVar27 < (int)uVar21) {
      if (iVar27 == 0) {
        uVar34 = 8;
      }
      else {
        uVar34 = iVar27 / 2 + iVar27;
      }
      if ((int)uVar34 <= (int)uVar21) {
        uVar34 = uVar21;
      }
      __dest = (ImGuiTabItem *)MemAlloc((long)(int)uVar34 * 0x28);
      pIVar29 = (tab_bar->Tabs).Data;
      if (pIVar29 != (ImGuiTabItem *)0x0) {
        memcpy(__dest,pIVar29,(long)(tab_bar->Tabs).Size * 0x28);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = __dest;
      (tab_bar->Tabs).Capacity = uVar34;
    }
    (tab_bar->Tabs).Size = uVar21;
  }
  if ((~bVar33 & 1) == 0 && 1 < uVar21) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar21,0x28,TabItemComparerBySection);
  }
  fVar42 = local_f8[0];
  uVar34 = uStack_ec;
  uVar30 = (ulong)uStack_ec;
  iVar27 = (int)uStack_e0;
  fVar39 = 0.0;
  local_114 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_f8[0]) {
    fVar39 = (pIVar15->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,fVar39);
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_114 = (pIVar15->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_114,(float)local_e8);
  IVar26 = tab_bar->NextSelectedTabId;
  if (IVar26 != 0) {
    tab_bar->SelectedTabId = IVar26;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar17 = TabBarProcessReorder(tab_bar);
    if ((bVar17) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar26 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar14 = GImGui;
  local_100 = uVar30;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar40 = (GImGui->Style).FramePadding.y;
    fVar43 = GImGui->FontSize;
    IVar5 = (pIVar4->DC).CursorPos;
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar40;
    (pIVar4->DC).CursorPos.y = fVar41;
    (tab_bar->BarRect).Min.x = fVar43 + fVar40 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar14->Style).Colors[0].x;
    local_58.y = (pIVar14->Style).Colors[0].y;
    uVar10 = (pIVar14->Style).Colors[0].z;
    uVar11 = (pIVar14->Style).Colors[0].w;
    local_58.w = (float)uVar11 * 0.5;
    local_58.z = (float)uVar10;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar17 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar17) {
      iVar37 = (tab_bar->Tabs).Size;
      if (0 < iVar37) {
        local_c8._0_8_ = pIVar4;
        lVar23 = 0;
        lVar38 = 0;
        pIVar35 = (ImGuiID *)0x0;
        do {
          pIVar29 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar29->Flags + lVar23 + 2) & 0x20) == 0) {
            iVar37 = *(int *)((long)&pIVar29->NameOffset + lVar23);
            if (((long)iVar37 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar37))
            goto LAB_0018aecb;
            pIVar36 = (ImGuiID *)((long)&pIVar29->ID + lVar23);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar17 = Selectable((tab_bar->TabsNames).Buf.Data + iVar37,
                                tab_bar->SelectedTabId == *pIVar36,0,(ImVec2 *)&local_78);
            if (bVar17) {
              pIVar35 = pIVar36;
            }
            iVar37 = (tab_bar->Tabs).Size;
          }
          lVar38 = lVar38 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar38 < iVar37);
        EndPopup();
        *(ImVec2 *)(local_c8._0_8_ + 0xd8) = IVar5;
        uVar34 = (uint)local_100;
        if (pIVar35 != (ImGuiID *)0x0) {
          IVar26 = *pIVar35;
          tab_bar->SelectedTabId = IVar26;
        }
        goto LAB_0018a3a5;
      }
      EndPopup();
    }
    (pIVar4->DC).CursorPos = IVar5;
  }
LAB_0018a3a5:
  local_ac[0] = 0;
  local_ac[1] = iVar27 + (int)fVar42;
  local_a4 = fVar42;
  iVar27 = (tab_bar->Tabs).Size;
  iVar37 = (pIVar15->ShrinkWidthBuffer).Capacity;
  iVar22 = iVar27;
  if (iVar37 < iVar27) {
    if (iVar37 == 0) {
      iVar37 = 8;
    }
    else {
      iVar37 = iVar37 / 2 + iVar37;
    }
    if (iVar37 <= iVar27) {
      iVar37 = iVar27;
    }
    __dest_00 = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar37 << 3);
    pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
    if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest_00,pIVar6,(long)(pIVar15->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar15->ShrinkWidthBuffer).Data);
    }
    (pIVar15->ShrinkWidthBuffer).Data = __dest_00;
    (pIVar15->ShrinkWidthBuffer).Capacity = iVar37;
    iVar22 = (tab_bar->Tabs).Size;
    uVar34 = (uint)local_100;
  }
  (pIVar15->ShrinkWidthBuffer).Size = iVar27;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_c8._8_8_;
  local_c8 = auVar47 << 0x40;
  if (iVar22 < 1) {
    bVar17 = true;
    local_120 = (ImGuiID *)0x0;
  }
  else {
    lVar23 = 0;
    lVar38 = 0;
    local_120 = (ImGuiID *)0x0;
    bVar17 = false;
    iVar27 = -1;
    do {
      pIVar29 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar29->LastFrameVisible + lVar23) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                      ,0x1cf5,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar35 = (ImGuiID *)((long)&pIVar29->ID + lVar23);
      if (((local_120 == (ImGuiID *)0x0) ||
          ((int)local_120[3] < *(int *)((long)&pIVar29->LastFrameSelected + lVar23))) &&
         ((*(byte *)((long)&pIVar29->Flags + lVar23 + 2) & 0x20) == 0)) {
        local_120 = pIVar35;
      }
      IVar20 = *pIVar35;
      if (IVar20 == tab_bar->SelectedTabId) {
        bVar17 = true;
      }
      if ((IVar26 == 0) && (IVar26 = IVar20, pIVar15->NavJustMovedToId != IVar20)) {
        IVar26 = 0;
      }
      iVar37 = *(int *)((long)&pIVar29->NameOffset + lVar23);
      if (((long)iVar37 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar37)) {
LAB_0018aecb:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_internal.h"
                      ,0x89c,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar5 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar37,
                              (*(uint *)((long)&pIVar29->Flags + lVar23) >> 0x14 & 1) == 0);
      auVar47 = local_c8;
      fVar40 = IVar5.x;
      *(float *)((long)&pIVar29->ContentWidth + lVar23) = fVar40;
      uVar34 = *(uint *)((long)&pIVar29->Flags + lVar23);
      uVar30 = (ulong)(((char)uVar34 < '\0') + 1);
      if ((uVar34 & 0x40) != 0) {
        uVar30 = 0;
      }
      fVar43 = 0.0;
      if ((int)uVar30 == iVar27) {
        fVar43 = (pIVar15->Style).ItemInnerSpacing.x;
      }
      local_f8[uVar30 * 3 + 1] = fVar43 + fVar40 + local_f8[uVar30 * 3 + 1];
      iVar27 = local_ac[uVar30];
      lVar24 = (long)iVar27;
      local_ac[uVar30] = iVar27 + 1;
      if ((lVar24 < 0) || ((pIVar15->ShrinkWidthBuffer).Size <= iVar27)) goto LAB_0018aeb4;
      pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
      pIVar6[lVar24].Index = (int)lVar38;
      if ((pIVar15->ShrinkWidthBuffer).Size <= iVar27) goto LAB_0018aeb4;
      pIVar6[lVar24].Width = fVar40;
      if (fVar40 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                      ,0x1d10,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&pIVar29->Width + lVar23) = fVar40;
      lVar38 = lVar38 + 1;
      iVar37 = (tab_bar->Tabs).Size;
      lVar23 = lVar23 + 0x28;
      iVar27 = (int)uVar30;
    } while (lVar38 < iVar37);
    local_c8._1_7_ = 0;
    local_c8[0] = 1 < iVar37;
    local_c8._8_8_ = auVar47._8_8_;
    bVar17 = !bVar17;
    uVar34 = (uint)local_100;
  }
  fVar40 = 0.0;
  lVar23 = 8;
  do {
    fVar40 = fVar40 + *(float *)((long)&local_100 + lVar23 + 4) +
                      *(float *)((long)local_f8 + lVar23);
    lVar23 = lVar23 + 0xc;
  } while (lVar23 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar40;
  pIVar14 = GImGui;
  fVar43 = (tab_bar->BarRect).Max.x;
  if (((local_c8[0] & fVar43 - (tab_bar->BarRect).Min.x < fVar40) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar4 = GImGui->CurrentWindow;
    fVar43 = GImGui->FontSize + -2.0;
    local_c8 = ZEXT416((uint)fVar43);
    fVar40 = (GImGui->Style).FramePadding.y;
    _local_98 = ZEXT416((uint)(fVar40 + fVar40 + GImGui->FontSize));
    local_88 = ZEXT416((uint)(fVar43 + fVar43));
    local_a0 = (pIVar4->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar12 = (GImGui->Style).Colors[0].z;
    uVar13 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar13 * 0.5;
    local_58.z = (float)uVar12;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_60._0_4_ = (pIVar14->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar14->IO).KeyRepeatRate;
    (pIVar14->IO).KeyRepeatDelay = 0.25;
    (pIVar14->IO).KeyRepeatRate = 0.2;
    fVar40 = (tab_bar->BarRect).Min.x;
    fVar43 = (tab_bar->BarRect).Max.x - (float)local_88._0_4_;
    uVar34 = -(uint)(fVar43 <= fVar40);
    fVar43 = (float)(uVar34 & (uint)fVar40 | ~uVar34 & (uint)fVar43);
    local_48 = ZEXT416((uint)fVar43);
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = fVar43;
    (pIVar4->DC).CursorPos.y = fVar40;
    uVar16 = local_98._0_4_;
    uStack_8c = local_98._4_4_;
    local_98._4_4_ = local_98._0_4_;
    local_98._0_4_ = local_c8._0_4_;
    uStack_90 = local_c8._4_4_;
    IVar5.y = (float)uVar16;
    IVar5.x = (float)local_c8._0_4_;
    bVar18 = ArrowButtonEx("##<",0,IVar5,0x410);
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_c8._0_4_;
    (pIVar4->DC).CursorPos.y = fVar40;
    bVar19 = ArrowButtonEx("##>",1,(ImVec2)local_98,0x410);
    iVar27 = -(uint)bVar18;
    if (bVar19) {
      iVar27 = 1;
    }
    PopStyleColor(2);
    (pIVar14->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar14->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (((iVar27 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar23 = (long)(tab_bar->Tabs).Size, 0 < lVar23)) {
      pIVar29 = (tab_bar->Tabs).Data;
      do {
        if (pIVar29->ID == tab_bar->SelectedTabId) {
          uVar21 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar29);
          iVar37 = (tab_bar->Tabs).Size;
          uVar34 = (uint)local_100;
          goto LAB_0018ae16;
        }
        pIVar29 = pIVar29 + 1;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
    (pIVar4->DC).CursorPos = local_a0;
    fVar43 = (tab_bar->BarRect).Max.x - ((float)local_88._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar43;
    uVar34 = (uint)local_100;
  }
  goto LAB_0018a863;
LAB_0018aeb4:
  pcVar25 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_0018aeaa;
LAB_0018ae95:
  pcVar25 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_0018aeaa:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                ,0x702,pcVar25);
  while( true ) {
    pIVar29 = (tab_bar->Tabs).Data;
    if (((pIVar29[uVar31].Flags & 0x200000) == 0) ||
       ((iVar22 = uVar21 + iVar27 * 2, iVar22 < 0 || (uVar21 = uVar28, iVar37 <= iVar22)))) break;
LAB_0018ae16:
    uVar28 = iVar27 + uVar21;
    uVar31 = uVar21;
    if ((int)uVar28 < iVar37) {
      uVar31 = uVar28;
    }
    if ((int)uVar28 < 0) {
      uVar31 = uVar21;
    }
    if (((int)uVar31 < 0) || (iVar37 <= (int)uVar31)) goto LAB_0018ae95;
  }
  pIVar29 = pIVar29 + uVar31;
  (pIVar4->DC).CursorPos = local_a0;
  fVar43 = (tab_bar->BarRect).Max.x - ((float)local_88._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar43;
  IVar26 = pIVar29->ID;
  if ((pIVar29->Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = IVar26;
  }
LAB_0018a863:
  fVar40 = local_f8[1] + fVar39 + uStack_e0._4_4_ + 0.0;
  fVar43 = fVar43 - (tab_bar->BarRect).Min.x;
  if (fVar40 < fVar43) {
    fVar41 = ((float)local_e8 + local_114) -
             ((fVar43 - (local_f8[1] + fVar39)) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar41) goto LAB_0018a8bb;
  }
  else {
    fVar41 = fVar40 - fVar43;
LAB_0018a8bb:
    if ((0.0 < fVar41) && ((fVar43 <= fVar40 || ((tab_bar->Flags & 0x40U) != 0)))) {
      if (fVar43 <= fVar40) {
        uVar34 = (int)uStack_e0 + (int)fVar42;
      }
      uVar21 = 0;
      if (fVar40 < fVar43) {
        uVar21 = (int)uStack_e0 + (int)fVar42;
      }
      ShrinkWidths((pIVar15->ShrinkWidthBuffer).Data + (int)uVar21,uVar34,fVar41);
      if (0 < (int)uVar34) {
        uVar30 = (ulong)uVar21;
        do {
          if (((int)uVar21 < 0) || ((pIVar15->ShrinkWidthBuffer).Size <= (int)uVar30))
          goto LAB_0018aeb4;
          pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
          iVar27 = pIVar6[uVar30].Index;
          lVar23 = (long)iVar27;
          if ((lVar23 < 0) || ((tab_bar->Tabs).Size <= iVar27)) goto LAB_0018ae95;
          iVar27 = (int)pIVar6[uVar30].Width;
          if (-1 < iVar27) {
            pIVar29 = (tab_bar->Tabs).Data;
            fVar40 = (float)iVar27;
            lVar38 = (ulong)((char)pIVar29[lVar23].Flags < '\0') + 1;
            if ((pIVar29[lVar23].Flags & 0x40U) != 0) {
              lVar38 = 0;
            }
            local_f8[lVar38 * 3 + 1] = local_f8[lVar38 * 3 + 1] - (pIVar29[lVar23].Width - fVar40);
            pIVar29[lVar23].Width = fVar40;
          }
          uVar30 = uVar30 + 1;
        } while ((int)uVar30 < (int)(uVar34 + uVar21));
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar23 = 0;
  fVar43 = 0.0;
  fVar40 = 0.0;
  uVar34 = 0;
  do {
    fVar41 = fVar40;
    if ((lVar23 == 2) &&
       (fVar41 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[7],
       fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41), fVar40 <= fVar41)) {
      fVar41 = fVar40;
    }
    fVar44 = local_f8[lVar23 * 3];
    if (0 < (long)(int)fVar44) {
      lVar38 = (ulong)uVar34 * 0x28 + 0x14;
      uVar30 = 0;
      do {
        if (((int)uVar34 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar34 + (int)uVar30)))
        goto LAB_0018ae95;
        pIVar29 = (tab_bar->Tabs).Data;
        *(float *)((long)pIVar29 + lVar38 + -4) = fVar41;
        fVar40 = 0.0;
        if (uVar30 < (int)fVar44 - 1) {
          fVar40 = (pIVar15->Style).ItemInnerSpacing.x;
        }
        fVar41 = fVar41 + fVar40 + *(float *)((long)&pIVar29->ID + lVar38);
        uVar30 = uVar30 + 1;
        lVar38 = lVar38 + 0x28;
      } while ((long)(int)fVar44 != uVar30);
    }
    fVar40 = local_f8[lVar23 * 3 + 2];
    fVar48 = local_f8[lVar23 * 3 + 1] + fVar40;
    fVar43 = fVar43 + (float)(-(uint)(0.0 <= fVar48) & (uint)fVar48);
    tab_bar->WidthAllTabs = fVar43;
    fVar40 = fVar41 + fVar40;
    uVar34 = (int)fVar44 + uVar34;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (bVar17) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    IVar20 = tab_bar->SelectedTabId;
    if (IVar20 != 0) goto LAB_0018aac0;
  }
  IVar20 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar20 = 0, local_120 != (ImGuiID *)0x0)) {
    IVar20 = *local_120;
    tab_bar->SelectedTabId = IVar20;
    IVar26 = IVar20;
  }
LAB_0018aac0:
  tab_bar->VisibleTabId = IVar20;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((IVar26 != 0) && (lVar23 = (long)(tab_bar->Tabs).Size, 0 < lVar23)) {
    pIVar29 = (tab_bar->Tabs).Data;
    do {
      if (pIVar29->ID == IVar26) {
        if ((pIVar29->Flags & 0xc0) != 0) break;
        fVar40 = GImGui->FontSize;
        iVar27 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar29);
        fVar43 = (tab_bar->BarRect).Max.x;
        fVar41 = (tab_bar->BarRect).Min.x;
        fVar48 = pIVar29->Offset - local_f8[1];
        fVar44 = fVar40;
        if (iVar27 < (int)fVar42) {
          fVar44 = -0.0;
        }
        fVar44 = fVar48 - fVar44;
        if ((tab_bar->Tabs).Size - (int)uStack_e0 <= iVar27 + 1) {
          fVar40 = 1.0;
        }
        fVar40 = fVar48 + pIVar29->Width + fVar40;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        if ((fVar44 < tab_bar->ScrollingTarget) ||
           (fVar42 = (((fVar43 - fVar41) - local_f8[1]) - uStack_e0._4_4_) - local_114,
           fVar42 <= fVar40 - fVar44)) {
          fVar43 = tab_bar->ScrollingAnim - fVar40;
        }
        else {
          if (fVar40 - fVar42 <= tab_bar->ScrollingTarget) break;
          fVar43 = (fVar44 - fVar42) - tab_bar->ScrollingAnim;
          fVar44 = fVar40 - fVar42;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
        tab_bar->ScrollingTarget = fVar44;
        break;
      }
      pIVar29 = pIVar29 + 1;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  fVar42 = (tab_bar->BarRect).Min.x;
  fVar40 = (tab_bar->BarRect).Max.x;
  auVar45._0_4_ = tab_bar->WidthAllTabs - (fVar40 - fVar42);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar46._4_4_ = uVar3;
  auVar46._0_4_ = uVar2;
  auVar46._8_8_ = 0;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar47 = minps(auVar46,auVar45);
  fVar43 = (float)(-(uint)(0.0 <= auVar47._0_4_) & (uint)auVar47._0_4_);
  fVar41 = (float)(-(uint)(0.0 <= auVar47._4_4_) & (uint)auVar47._4_4_);
  tab_bar->ScrollingAnim = fVar43;
  tab_bar->ScrollingTarget = fVar41;
  if ((fVar43 != fVar41) || (NAN(fVar43) || NAN(fVar41))) {
    fVar44 = pIVar15->FontSize;
    fVar48 = fVar44 * 70.0;
    uVar34 = -(uint)(fVar48 <= tab_bar->ScrollingSpeed);
    fVar49 = ABS(fVar41 - fVar43) / 0.3;
    fVar48 = (float)(~uVar34 & (uint)fVar48 | (uint)tab_bar->ScrollingSpeed & uVar34);
    uVar34 = -(uint)(fVar49 <= fVar48);
    fVar49 = (float)(~uVar34 & (uint)fVar49 | uVar34 & (uint)fVar48);
    tab_bar->ScrollingSpeed = fVar49;
    fVar48 = fVar41;
    if ((pIVar15->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar44 * 10.0)) {
      fVar49 = fVar49 * (pIVar15->IO).DeltaTime;
      if (fVar41 <= fVar43) {
        fVar48 = fVar43;
        if (fVar41 < fVar43) {
          fVar43 = fVar43 - fVar49;
          uVar34 = -(uint)(fVar41 <= fVar43);
          fVar48 = (float)((uint)fVar43 & uVar34 | ~uVar34 & (uint)fVar41);
        }
      }
      else {
        fVar48 = fVar43 + fVar49;
        if (fVar41 <= fVar48) {
          fVar48 = fVar41;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar48;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar39 + fVar42 + local_f8[1];
  tab_bar->ScrollingRectMaxX = (fVar40 - uStack_e0._4_4_) - local_114;
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      pcVar25 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar25 != (char *)0x0) {
        memcpy(__dest_01,pcVar25,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_01;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar4 = pIVar15->CurrentWindow;
  (pIVar4->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar42 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar39 = (pIVar4->DC).IdealMaxPos.x;
  uVar34 = -(uint)(fVar42 <= fVar39);
  (pIVar4->DC).IdealMaxPos.x = (float)(uVar34 & (uint)fVar39 | ~uVar34 & (uint)fVar42);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}